

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

string * cmsys::SystemTools::RelativePath
                   (string *__return_storage_ptr__,string *local,string *remote)

{
  bool bVar1;
  uint uVar2;
  size_type sVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  reference pvVar4;
  ulong uVar5;
  reference __x;
  reference pcVar6;
  string *psVar7;
  __type local_199;
  reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_178 [8];
  __normal_iterator<cmsys::String_*,_std::vector<cmsys::String,_std::allocator<cmsys::String>_>_>
  local_170;
  __normal_iterator<cmsys::String_*,_std::vector<cmsys::String,_std::allocator<cmsys::String>_>_>
  local_168;
  iterator vit1;
  __normal_iterator<cmsys::String_*,_std::vector<cmsys::String,_std::allocator<cmsys::String>_>_>
  local_158;
  __normal_iterator<cmsys::String_*,_std::vector<cmsys::String,_std::allocator<cmsys::String>_>_>
  local_150;
  iterator vit;
  uint local_128;
  uint i;
  String local_100;
  uint local_dc;
  undefined1 local_d8 [4];
  uint sameCount;
  vector<cmsys::String,_std::allocator<cmsys::String>_> finalPath;
  vector<cmsys::String,_std::allocator<cmsys::String>_> commonPath;
  vector<cmsys::String,_std::allocator<cmsys::String>_> remoteSplit;
  vector<cmsys::String,_std::allocator<cmsys::String>_> localSplit;
  string r;
  string l;
  allocator local_21;
  string *local_20;
  string *remote_local;
  string *local_local;
  string *relativePath;
  
  local_20 = remote;
  remote_local = local;
  local_local = __return_storage_ptr__;
  bVar1 = FileIsFullPath(local);
  if (bVar1) {
    bVar1 = FileIsFullPath(local_20);
    if (bVar1) {
      CollapseFullPath((string *)((long)&r.field_2 + 8),remote_local);
      CollapseFullPath((string *)
                       &localSplit.super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,local_20);
      SplitString((vector<cmsys::String,_std::allocator<cmsys::String>_> *)
                  &remoteSplit.super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage,
                  (string *)((long)&r.field_2 + 8),'/',true);
      SplitString((vector<cmsys::String,_std::allocator<cmsys::String>_> *)
                  &commonPath.super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage,
                  (string *)
                  &localSplit.super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage,'/',true);
      std::vector<cmsys::String,_std::allocator<cmsys::String>_>::vector
                ((vector<cmsys::String,_std::allocator<cmsys::String>_> *)
                 &finalPath.super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      std::vector<cmsys::String,_std::allocator<cmsys::String>_>::vector
                ((vector<cmsys::String,_std::allocator<cmsys::String>_> *)local_d8);
      local_dc = 0;
      while( true ) {
        uVar5 = (ulong)local_dc;
        sVar3 = std::vector<cmsys::String,_std::allocator<cmsys::String>_>::size
                          ((vector<cmsys::String,_std::allocator<cmsys::String>_> *)
                           &remoteSplit.
                            super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
        local_199 = false;
        if (uVar5 <= sVar3 - 1) {
          uVar5 = (ulong)local_dc;
          sVar3 = std::vector<cmsys::String,_std::allocator<cmsys::String>_>::size
                            ((vector<cmsys::String,_std::allocator<cmsys::String>_> *)
                             &commonPath.
                              super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage);
          local_199 = false;
          if (uVar5 <= sVar3 - 1) {
            __lhs = &std::vector<cmsys::String,_std::allocator<cmsys::String>_>::operator[]
                               ((vector<cmsys::String,_std::allocator<cmsys::String>_> *)
                                &remoteSplit.
                                 super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_dc)
                     ->super_string;
            __rhs = &std::vector<cmsys::String,_std::allocator<cmsys::String>_>::operator[]
                               ((vector<cmsys::String,_std::allocator<cmsys::String>_> *)
                                &commonPath.
                                 super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_dc)
                     ->super_string;
            local_199 = std::operator==(__lhs,__rhs);
          }
        }
        if (local_199 == false) break;
        pvVar4 = std::vector<cmsys::String,_std::allocator<cmsys::String>_>::operator[]
                           ((vector<cmsys::String,_std::allocator<cmsys::String>_> *)
                            &remoteSplit.
                             super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_dc);
        std::vector<cmsys::String,_std::allocator<cmsys::String>_>::push_back
                  ((vector<cmsys::String,_std::allocator<cmsys::String>_> *)
                   &finalPath.super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,pvVar4);
        String::String(&local_100,"");
        pvVar4 = std::vector<cmsys::String,_std::allocator<cmsys::String>_>::operator[]
                           ((vector<cmsys::String,_std::allocator<cmsys::String>_> *)
                            &remoteSplit.
                             super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_dc);
        String::operator=(pvVar4,&local_100);
        String::~String(&local_100);
        String::String((String *)&i,"");
        pvVar4 = std::vector<cmsys::String,_std::allocator<cmsys::String>_>::operator[]
                           ((vector<cmsys::String,_std::allocator<cmsys::String>_> *)
                            &commonPath.
                             super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_dc);
        String::operator=(pvVar4,(String *)&i);
        String::~String((String *)&i);
        local_dc = local_dc + 1;
      }
      if (local_dc == 0) {
        std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_20);
      }
      else {
        for (local_128 = 0;
            sVar3 = std::vector<cmsys::String,_std::allocator<cmsys::String>_>::size
                              ((vector<cmsys::String,_std::allocator<cmsys::String>_> *)
                               &remoteSplit.
                                super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage),
            local_128 < sVar3; local_128 = local_128 + 1) {
          std::vector<cmsys::String,_std::allocator<cmsys::String>_>::operator[]
                    ((vector<cmsys::String,_std::allocator<cmsys::String>_> *)
                     &remoteSplit.super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_128);
          uVar5 = std::__cxx11::string::empty();
          if ((uVar5 & 1) == 0) {
            String::String((String *)&vit,"../");
            std::vector<cmsys::String,_std::allocator<cmsys::String>_>::push_back
                      ((vector<cmsys::String,_std::allocator<cmsys::String>_> *)local_d8,
                       (value_type *)&vit);
            String::~String((String *)&vit);
          }
        }
        local_150._M_current =
             (String *)
             std::vector<cmsys::String,_std::allocator<cmsys::String>_>::begin
                       ((vector<cmsys::String,_std::allocator<cmsys::String>_> *)
                        &commonPath.
                         super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
        while( true ) {
          local_158._M_current =
               (String *)
               std::vector<cmsys::String,_std::allocator<cmsys::String>_>::end
                         ((vector<cmsys::String,_std::allocator<cmsys::String>_> *)
                          &commonPath.
                           super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage);
          bVar1 = __gnu_cxx::operator!=(&local_150,&local_158);
          if (!bVar1) break;
          __gnu_cxx::
          __normal_iterator<cmsys::String_*,_std::vector<cmsys::String,_std::allocator<cmsys::String>_>_>
          ::operator->(&local_150);
          uVar5 = std::__cxx11::string::empty();
          if ((uVar5 & 1) == 0) {
            __x = __gnu_cxx::
                  __normal_iterator<cmsys::String_*,_std::vector<cmsys::String,_std::allocator<cmsys::String>_>_>
                  ::operator*(&local_150);
            std::vector<cmsys::String,_std::allocator<cmsys::String>_>::push_back
                      ((vector<cmsys::String,_std::allocator<cmsys::String>_> *)local_d8,__x);
          }
          __gnu_cxx::
          __normal_iterator<cmsys::String_*,_std::vector<cmsys::String,_std::allocator<cmsys::String>_>_>
          ::operator++(&local_150);
        }
        vit1._M_current._7_1_ = 0;
        std::__cxx11::string::string((string *)__return_storage_ptr__);
        local_168._M_current =
             (String *)
             std::vector<cmsys::String,_std::allocator<cmsys::String>_>::begin
                       ((vector<cmsys::String,_std::allocator<cmsys::String>_> *)local_d8);
        while( true ) {
          local_170._M_current =
               (String *)
               std::vector<cmsys::String,_std::allocator<cmsys::String>_>::end
                         ((vector<cmsys::String,_std::allocator<cmsys::String>_> *)local_d8);
          bVar1 = __gnu_cxx::operator!=(&local_168,&local_170);
          if (!bVar1) break;
          uVar2 = std::__cxx11::string::empty();
          bVar1 = false;
          if ((uVar2 & 1) == 0) {
            std::__cxx11::string::rbegin();
            pcVar6 = std::
                     reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator*(local_178);
            bVar1 = *pcVar6 != '/';
          }
          if (bVar1) {
            std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"/");
          }
          psVar7 = (string *)
                   __gnu_cxx::
                   __normal_iterator<cmsys::String_*,_std::vector<cmsys::String,_std::allocator<cmsys::String>_>_>
                   ::operator*(&local_168);
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,psVar7);
          __gnu_cxx::
          __normal_iterator<cmsys::String_*,_std::vector<cmsys::String,_std::allocator<cmsys::String>_>_>
          ::operator++(&local_168);
        }
        vit1._M_current._7_1_ = 1;
      }
      std::vector<cmsys::String,_std::allocator<cmsys::String>_>::~vector
                ((vector<cmsys::String,_std::allocator<cmsys::String>_> *)local_d8);
      std::vector<cmsys::String,_std::allocator<cmsys::String>_>::~vector
                ((vector<cmsys::String,_std::allocator<cmsys::String>_> *)
                 &finalPath.super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      std::vector<cmsys::String,_std::allocator<cmsys::String>_>::~vector
                ((vector<cmsys::String,_std::allocator<cmsys::String>_> *)
                 &commonPath.super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      std::vector<cmsys::String,_std::allocator<cmsys::String>_>::~vector
                ((vector<cmsys::String,_std::allocator<cmsys::String>_> *)
                 &remoteSplit.super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::string::~string
                ((string *)
                 &localSplit.super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::string::~string((string *)(r.field_2._M_local_buf + 8));
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)__return_storage_ptr__,"",(allocator *)(l.field_2._M_local_buf + 0xb));
      std::allocator<char>::~allocator((allocator<char> *)(l.field_2._M_local_buf + 0xb));
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_21);
    std::allocator<char>::~allocator((allocator<char> *)&local_21);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string SystemTools::RelativePath(const std::string& local,
                                      const std::string& remote)
{
  if (!SystemTools::FileIsFullPath(local)) {
    return "";
  }
  if (!SystemTools::FileIsFullPath(remote)) {
    return "";
  }

  std::string l = SystemTools::CollapseFullPath(local);
  std::string r = SystemTools::CollapseFullPath(remote);

  // split up both paths into arrays of strings using / as a separator
  std::vector<kwsys::String> localSplit =
    SystemTools::SplitString(l, '/', true);
  std::vector<kwsys::String> remoteSplit =
    SystemTools::SplitString(r, '/', true);
  std::vector<kwsys::String>
    commonPath; // store shared parts of path in this array
  std::vector<kwsys::String> finalPath; // store the final relative path here
  // count up how many matching directory names there are from the start
  unsigned int sameCount = 0;
  while (((sameCount <= (localSplit.size() - 1)) &&
          (sameCount <= (remoteSplit.size() - 1))) &&
// for windows and apple do a case insensitive string compare
#if defined(_WIN32) || defined(__APPLE__)
         SystemTools::Strucmp(localSplit[sameCount].c_str(),
                              remoteSplit[sameCount].c_str()) == 0
#else
         localSplit[sameCount] == remoteSplit[sameCount]
#endif
         ) {
    // put the common parts of the path into the commonPath array
    commonPath.push_back(localSplit[sameCount]);
    // erase the common parts of the path from the original path arrays
    localSplit[sameCount] = "";
    remoteSplit[sameCount] = "";
    sameCount++;
  }